

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *__s_00;
  char *pcVar4;
  size_t sVar5;
  _Alloc_hider _Var6;
  string *__range2;
  size_type sVar7;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  string format;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  FilePath local_130;
  FilePath local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  FilePath local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,FLAGS_gtest_output_abi_cxx11_,
             DAT_0015f628 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_70[0];
  GetOutputFormat_abi_cxx11_();
  if (local_88 == 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xml","");
    GetAbsolutePathToOutputFile_abi_cxx11_();
  }
  pcVar4 = strchr((char *)__s_00,0x3a);
  if (pcVar4 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_b0);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_130.pathname_._M_dataplus._M_p,
               local_130.pathname_._M_dataplus._M_p + local_130.pathname_._M_string_length);
    _Var6._M_p = local_158._M_dataplus._M_p;
    if (local_158._M_string_length != 0) {
      sVar7 = 0;
      do {
        if (((local_158._M_dataplus._M_p[sVar7] != '/') ||
            (_Var6._M_p == local_158._M_dataplus._M_p)) || (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = local_158._M_dataplus._M_p[sVar7];
          _Var6._M_p = _Var6._M_p + 1;
        }
        sVar7 = sVar7 + 1;
      } while (local_158._M_string_length != sVar7);
    }
    local_158._M_string_length = (long)_Var6._M_p - (long)local_158._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    paVar2 = &local_d0.pathname_.field_2;
    local_d0.pathname_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"test_detail","");
    paVar1 = &local_110.pathname_.field_2;
    local_110.pathname_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_d0.pathname_._M_dataplus._M_p,
               local_d0.pathname_._M_dataplus._M_p + local_d0.pathname_._M_string_length);
    _Var6._M_p = local_110.pathname_._M_dataplus._M_p;
    if (local_110.pathname_._M_string_length != 0) {
      sVar7 = 0;
      do {
        if (((local_110.pathname_._M_dataplus._M_p[sVar7] != '/') ||
            (_Var6._M_p == local_110.pathname_._M_dataplus._M_p)) || (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = local_110.pathname_._M_dataplus._M_p[sVar7];
          _Var6._M_p = _Var6._M_p + 1;
        }
        sVar7 = sVar7 + 1;
      } while (local_110.pathname_._M_string_length != sVar7);
    }
    local_110.pathname_._M_string_length =
         (long)_Var6._M_p - (long)local_110.pathname_._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    FilePath::MakeFileName
              ((FilePath *)&local_f0,(FilePath *)&local_158,&local_110,0,(char *)local_90);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.pathname_._M_dataplus._M_p,
                      local_110.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.pathname_._M_dataplus._M_p,
                      local_d0.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    _Var6._M_p = local_130.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.pathname_._M_dataplus._M_p == &local_130.pathname_.field_2) goto LAB_0011c1f4;
  }
  else {
    __s = pcVar4 + 1;
    paVar1 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,__s,pcVar4 + sVar5 + 1);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    _Var6._M_p = local_f0._M_dataplus._M_p;
    if (local_f0._M_string_length != 0) {
      sVar7 = 0;
      do {
        if (((local_f0._M_dataplus._M_p[sVar7] != '/') || (_Var6._M_p == local_f0._M_dataplus._M_p))
           || (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = local_f0._M_dataplus._M_p[sVar7];
          _Var6._M_p = _Var6._M_p + 1;
        }
        sVar7 = sVar7 + 1;
      } while (local_f0._M_string_length != sVar7);
    }
    local_f0._M_string_length = (long)_Var6._M_p - (long)local_f0._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (*local_f0._M_dataplus._M_p != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_131);
      paVar2 = &local_130.pathname_.field_2;
      local_130.pathname_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_110.pathname_._M_dataplus._M_p,
                 local_110.pathname_._M_dataplus._M_p + local_110.pathname_._M_string_length);
      _Var6._M_p = local_130.pathname_._M_dataplus._M_p;
      if (local_130.pathname_._M_string_length != 0) {
        sVar7 = 0;
        do {
          if (((local_130.pathname_._M_dataplus._M_p[sVar7] != '/') ||
              (_Var6._M_p == local_130.pathname_._M_dataplus._M_p)) || (_Var6._M_p[-1] != '/')) {
            *_Var6._M_p = local_130.pathname_._M_dataplus._M_p[sVar7];
            _Var6._M_p = _Var6._M_p + 1;
          }
          sVar7 = sVar7 + 1;
        } while (local_130.pathname_._M_string_length != sVar7);
      }
      local_130.pathname_._M_string_length =
           (long)_Var6._M_p - (long)local_130.pathname_._M_dataplus._M_p;
      *_Var6._M_p = '\0';
      local_b0 = local_a0;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar5);
      paVar3 = &local_d0.pathname_.field_2;
      local_d0.pathname_._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_b0,local_a8 + (long)local_b0);
      _Var6._M_p = local_d0.pathname_._M_dataplus._M_p;
      if (local_d0.pathname_._M_string_length != 0) {
        sVar7 = 0;
        do {
          if (((local_d0.pathname_._M_dataplus._M_p[sVar7] != '/') ||
              (_Var6._M_p == local_d0.pathname_._M_dataplus._M_p)) || (_Var6._M_p[-1] != '/')) {
            *_Var6._M_p = local_d0.pathname_._M_dataplus._M_p[sVar7];
            _Var6._M_p = _Var6._M_p + 1;
          }
          sVar7 = sVar7 + 1;
        } while (local_d0.pathname_._M_string_length != sVar7);
      }
      local_d0.pathname_._M_string_length =
           (long)_Var6._M_p - (long)local_d0.pathname_._M_dataplus._M_p;
      *_Var6._M_p = '\0';
      FilePath::ConcatPaths((FilePath *)&local_158,&local_130,&local_d0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_f0,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.pathname_._M_dataplus._M_p != paVar3) {
        operator_delete(local_d0.pathname_._M_dataplus._M_p,
                        local_d0.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != paVar2) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.pathname_._M_dataplus._M_p != &local_110.pathname_.field_2) {
        operator_delete(local_110.pathname_._M_dataplus._M_p,
                        local_110.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_f0._M_string_length == 0) ||
       (local_f0._M_dataplus._M_p[local_f0._M_string_length - 1] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)&local_158,(FilePath *)&local_f0,&local_130,
                 local_110.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.pathname_._M_dataplus._M_p != &local_110.pathname_.field_2) {
        operator_delete(local_110.pathname_._M_dataplus._M_p,
                        local_110.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != &local_130.pathname_.field_2) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    local_130.pathname_.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var6._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0011c1f4;
  }
  operator_delete(_Var6._M_p,local_130.pathname_.field_2._M_allocated_capacity + 1);
LAB_0011c1f4:
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}